

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_x25519.cc
# Opt level: O3

int pkey_x25519_derive(EVP_PKEY_CTX *ctx,uint8_t *out,size_t *out_len)

{
  void *pvVar1;
  uint8_t *peer_public_value;
  int iVar2;
  int line;
  
  if ((ctx->pkey == (EVP_PKEY *)0x0) || (ctx->peerkey == (EVP_PKEY *)0x0)) {
    iVar2 = 0x75;
    line = 0x2f;
  }
  else {
    pvVar1 = ctx->pkey->pkey;
    peer_public_value = (uint8_t *)ctx->peerkey->pkey;
    if (peer_public_value == (uint8_t *)0x0 || pvVar1 == (void *)0x0) {
      iVar2 = 0x75;
      line = 0x38;
    }
    else if (*(char *)((long)pvVar1 + 0x40) == '\0') {
      iVar2 = 0x82;
      line = 0x3d;
    }
    else {
      if (out == (uint8_t *)0x0) {
LAB_00189b9f:
        *out_len = 0x20;
        return 1;
      }
      if (*out_len < 0x20) {
        iVar2 = 100;
        line = 0x43;
      }
      else {
        iVar2 = X25519(out,(uint8_t *)((long)pvVar1 + 0x20),peer_public_value);
        if (iVar2 != 0) goto LAB_00189b9f;
        iVar2 = 0x86;
        line = 0x47;
      }
    }
  }
  ERR_put_error(6,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_x25519.cc"
                ,line);
  return 0;
}

Assistant:

static int pkey_x25519_derive(EVP_PKEY_CTX *ctx, uint8_t *out,
                              size_t *out_len) {
  if (ctx->pkey == NULL || ctx->peerkey == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_KEYS_NOT_SET);
    return 0;
  }

  const X25519_KEY *our_key =
      reinterpret_cast<const X25519_KEY *>(ctx->pkey->pkey);
  const X25519_KEY *peer_key =
      reinterpret_cast<const X25519_KEY *>(ctx->peerkey->pkey);
  if (our_key == NULL || peer_key == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_KEYS_NOT_SET);
    return 0;
  }

  if (!our_key->has_private) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NOT_A_PRIVATE_KEY);
    return 0;
  }

  if (out != NULL) {
    if (*out_len < 32) {
      OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
      return 0;
    }
    if (!X25519(out, our_key->priv, peer_key->pub)) {
      OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PEER_KEY);
      return 0;
    }
  }

  *out_len = 32;
  return 1;
}